

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

Ptr __thiscall core::image::load_png_file(image *this,string *filename)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  FILE *__stream;
  FileException *this_00;
  int *piVar5;
  char *msg;
  Exception *this_01;
  ulong uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar7;
  undefined1 local_80 [8];
  ImageHeaders headers;
  undefined1 auStack_68 [8];
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> row_pointers;
  png_infop local_48;
  png_infop png_info;
  png_structp local_38;
  png_structp png;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar5 = __errno_location();
    msg = strerror(*piVar5);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  local_38 = (png_structp)0x0;
  local_48 = (png_infop)0x0;
  anon_unknown_7::load_png_headers_intern
            ((FILE *)__stream,(ImageHeaders *)local_80,&local_38,&local_48);
  bVar2 = png_get_bit_depth(local_38,local_48);
  if (bVar2 < 9) {
    cVar3 = png_get_color_type(local_38,local_48);
    if (cVar3 == '\x03') {
      png_set_palette_to_rgb(local_38);
    }
    else if (bVar2 != 8 && cVar3 == '\0') {
      png_set_expand_gray_1_2_4_to_8(local_38);
    }
    iVar4 = png_get_valid(local_38,local_48,0x10);
    if (iVar4 != 0) {
      png_set_tRNS_to_alpha(local_38);
    }
    headers._8_8_ = __stream;
    png_read_update_info(local_38,local_48);
    Image<unsigned_char>::create();
    TypedImageBase<unsigned_char>::allocate
              (*(TypedImageBase<unsigned_char> **)this,local_80._0_4_,local_80._4_4_,headers.width);
    lVar1 = *(long *)this;
    auStack_68 = (undefined1  [8])0x0;
    row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::resize
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)auStack_68,
               (long)(int)local_80._4_4_);
    iVar4 = 0;
    if ((int)local_80._4_4_ < 1) {
      local_80._4_4_ = 0;
    }
    for (uVar6 = 0; (uint)local_80._4_4_ != uVar6; uVar6 = uVar6 + 1) {
      *(long *)((long)auStack_68 + uVar6 * 8) = *(long *)(lVar1 + 0x18) + (long)iVar4;
      iVar4 = iVar4 + headers.width * local_80._0_4_;
    }
    png_read_image(local_38,auStack_68);
    png_destroy_read_struct(&local_38,&local_48,0);
    fclose((FILE *)headers._8_8_);
    std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
              ((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)auStack_68);
    PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  png_destroy_read_struct(&local_38,&local_48,0);
  fclose(__stream);
  this_01 = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)auStack_68,"PNG with more than 8 bit",(allocator *)((long)&png_info + 7));
  util::Exception::Exception(this_01,(string *)auStack_68);
  __cxa_throw(this_01,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ByteImage::Ptr
load_png_file (std::string const& filename)
{
    // TODO: use throw-safe FILE* wrapper
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    /* Read PNG header info. */
    ImageHeaders headers;
    png_structp png = nullptr;
    png_infop png_info = nullptr;
    load_png_headers_intern(fp, &headers, &png, &png_info);

    /* Check if bit depth is valid. */
    int const bit_depth = png_get_bit_depth(png, png_info);
    if (bit_depth > 8)
    {
        png_destroy_read_struct(&png, &png_info, nullptr);
        std::fclose(fp);
        throw util::Exception("PNG with more than 8 bit");
    }

    /* Apply transformations. */
    int const color_type = png_get_color_type(png, png_info);
    if (color_type == PNG_COLOR_TYPE_PALETTE)
        png_set_palette_to_rgb(png);
    if (color_type == PNG_COLOR_TYPE_GRAY && bit_depth < 8)
        png_set_expand_gray_1_2_4_to_8(png);
    if (png_get_valid(png, png_info, PNG_INFO_tRNS))
        png_set_tRNS_to_alpha(png);

    /* Update the info struct to reflect the transformations. */
    png_read_update_info(png, png_info);

    /* Create image. */
    ByteImage::Ptr image = ByteImage::create();
    image->allocate(headers.width, headers.height, headers.channels);
    ByteImage::ImageData& data = image->get_data();

    /* Setup row pointers. */
    std::vector<png_bytep> row_pointers;
    row_pointers.resize(headers.height);
    for (int i = 0; i < headers.height; ++i)
        row_pointers[i] = &data[i * headers.width * headers.channels];

    /* Read the whole PNG in memory. */
    png_read_image(png, &row_pointers[0]);

    /* Clean up. */
    png_destroy_read_struct(&png, &png_info, nullptr);
    std::fclose(fp);

    return image;
}